

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

MemChunk * __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
splitChunk(MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this
          ,MemChunk *chunk,size_type size)

{
  size_type sVar1;
  MemChunk *this_00;
  MemChunk *remainChunk;
  size_type remainSize;
  size_type size_local;
  MemChunk *chunk_local;
  MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this_local;
  
  sVar1 = MemChunk::getChunkSize(chunk);
  if (0x1f < sVar1 - size) {
    this_00 = (MemChunk *)((long)&chunk->m_prevFootSize + size);
    MemChunk::setFreeChunkSize(chunk,size);
    MemChunk::setFreeChunkSize(this_00,sVar1 - size);
    addChunk(this,this_00);
  }
  return chunk;
}

Assistant:

inline MemChunk*
    splitChunk (MemChunk* chunk, size_type size)
    {
        // the size of the 2nd half after the split
        size_type remainSize = chunk->getChunkSize () - size;

        if (remainSize >= MIN_CHUNK_SIZE)
        {
            MemChunk* remainChunk = (MemChunk*)((char*)chunk + size);

            chunk->setFreeChunkSize (size);

            remainChunk->setFreeChunkSize (remainSize);

            addChunk (remainChunk);
        }
        return chunk;
    }